

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O0

V2x64U __thiscall highwayhash::SSE41::HHStateSSE41::ZipperMerge(HHStateSSE41 *this,V2x64U *v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  longlong extraout_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  V2x64U VVar3;
  V128<unsigned_long> local_68;
  Intrinsic local_58;
  undefined8 local_48;
  uint64_t lo;
  uint64_t hi;
  V2x64U *v_local;
  
  lo = 0x70806090d0a040b;
  local_48 = 0xf010e05020c03;
  hi = (uint64_t)v;
  v_local = &this->v0L;
  V128::operator_cast_to_function_pointer((V128 *)v);
  V128<unsigned_long>::V128(&local_68,0x70806090d0a040b,0xf010e05020c03);
  V128::operator_cast_to_function_pointer((V128 *)&local_68);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = extraout_XMM0_Qa;
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_8_ = extraout_XMM0_Qa_00;
  local_58 = (Intrinsic)pshufb(auVar2,auVar1);
  V128<unsigned_long>::V128(&this->v0L,&local_58);
  VVar3.v_[1] = extraout_RDX;
  VVar3.v_[0] = (longlong)this;
  return (V2x64U)VVar3.v_;
}

Assistant:

static HH_INLINE V2x64U ZipperMerge(const V2x64U& v) {
    // Multiplication mixes/scrambles bytes 0-7 of the 64-bit result to
    // varying degrees. In descending order of goodness, bytes
    // 3 4 2 5 1 6 0 7 have quality 228 224 164 160 100 96 36 32.
    // As expected, the upper and lower bytes are much worse.
    // For each 64-bit lane, our objectives are:
    // 1) maximizing and equalizing total goodness across each lane's bytes;
    // 2) mixing with bytes from the neighboring lane;
    // 3) placing the worst bytes in the upper 32 bits because those will not
    //    be used in the next 32x32 multiplication.
    const uint64_t hi = 0x070806090D0A040Bull;
    const uint64_t lo = 0x000F010E05020C03ull;
    return V2x64U(_mm_shuffle_epi8(v, V2x64U(hi, lo)));
  }